

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

llm_graph_input_attn_kv_unified * __thiscall
llm_graph_context::build_attn_inp_kv_unified(llm_graph_context *this)

{
  uint32_t uVar1;
  _func_int **pp_Var2;
  llm_graph_input_attn_kv_unified *plVar3;
  pointer __p;
  pointer *__ptr;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_28;
  __uniq_ptr_impl<llm_graph_input_i,_std::default_delete<llm_graph_input_i>_> local_20;
  llama_kv_cache_unified *kv_self;
  
  kv_self = (llama_kv_cache_unified *)this->memory;
  std::
  make_unique<llm_graph_input_attn_kv_unified,llama_hparams_const&,llama_cparams_const&,llama_kv_cache_unified_const*&>
            ((llama_hparams *)&local_28,(llama_cparams *)this->hparams,
             (llama_kv_cache_unified **)this->cparams);
  uVar1 = kv_self->n;
  pp_Var2 = (_func_int **)
            ggml_new_tensor_2d(this->ctx0,0,uVar1,(long)this->n_tokens + 0x3fU & 0xffffffffffffffc0)
  ;
  local_28._M_head_impl[1]._vptr_llm_graph_input_i = pp_Var2;
  ggml_set_input(pp_Var2);
  if (this->cparams->flash_attn == true) {
    pp_Var2 = (_func_int **)ggml_cast(this->ctx0,local_28._M_head_impl[1]._vptr_llm_graph_input_i,1)
    ;
  }
  else {
    pp_Var2 = local_28._M_head_impl[1]._vptr_llm_graph_input_i;
  }
  *(_func_int ***)((long)local_28._M_head_impl + 0x10) = pp_Var2;
  local_20._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)local_28;
  if (1 < this->hparams->n_swa_pattern) {
    if (this->hparams->n_swa == 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                 ,0x55f,"GGML_ASSERT(%s) failed","hparams.n_swa > 0");
    }
    pp_Var2 = (_func_int **)
              ggml_new_tensor_2d(this->ctx0,0,uVar1,
                                 (long)this->n_tokens + 0x3fU & 0xffffffffffffffc0);
    local_28._M_head_impl[3]._vptr_llm_graph_input_i = pp_Var2;
    ggml_set_input(pp_Var2);
    if (this->cparams->flash_attn == true) {
      pp_Var2 = (_func_int **)
                ggml_cast(this->ctx0,local_28._M_head_impl[3]._vptr_llm_graph_input_i,1);
    }
    else {
      pp_Var2 = local_28._M_head_impl[3]._vptr_llm_graph_input_i;
    }
    local_28._M_head_impl[4]._vptr_llm_graph_input_i = pp_Var2;
    local_20._M_t.
    super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
    super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
         (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)local_28._M_head_impl;
  }
  local_28._M_head_impl = (llm_graph_input_i *)0x0;
  plVar3 = (llm_graph_input_attn_kv_unified *)
           llm_graph_result::add_input
                     ((this->res)._M_t.
                      super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>
                      .super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
                      (llm_graph_input_ptr *)&local_20);
  if ((_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
      local_20._M_t.
      super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>.
      super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
                          .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl + 8))();
  }
  local_20._M_t.super__Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>
  .super__Head_base<0UL,_llm_graph_input_i_*,_false>._M_head_impl =
       (tuple<llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)
       (_Tuple_impl<0UL,_llm_graph_input_i_*,_std::default_delete<llm_graph_input_i>_>)0x0;
  if (local_28._M_head_impl != (llm_graph_input_i *)0x0) {
    (**(code **)(*(long *)local_28._M_head_impl + 8))();
  }
  return plVar3;
}

Assistant:

llm_graph_input_attn_kv_unified * llm_graph_context::build_attn_inp_kv_unified() const {
    const llama_kv_cache_unified * kv_self = static_cast<const llama_kv_cache_unified *>(memory);

    auto inp = std::make_unique<llm_graph_input_attn_kv_unified>(hparams, cparams, kv_self);

    const auto n_kv = kv_self->n;

    inp->self_kq_mask = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_kv, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
    //cb(inp->self_kq_mask, "KQ_mask", -1);
    ggml_set_input(inp->self_kq_mask);

    inp->self_kq_mask_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->self_kq_mask, GGML_TYPE_F16) : inp->self_kq_mask;

    if (hparams.n_swa_pattern > 1) {
        GGML_ASSERT(hparams.n_swa > 0);

        inp->self_kq_mask_swa = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_kv, GGML_PAD(n_tokens, GGML_KQ_MASK_PAD));
        //cb(inp->self_kq_mask_swa, "KQ_mask_swa", -1);
        ggml_set_input(inp->self_kq_mask_swa);

        inp->self_kq_mask_swa_cnv = cparams.flash_attn ? ggml_cast(ctx0, inp->self_kq_mask_swa, GGML_TYPE_F16) : inp->self_kq_mask_swa;
    }

    return (llm_graph_input_attn_kv_unified *) res->add_input(std::move(inp));
}